

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void sync_c0_status_mips64(CPUMIPSState_conflict5 *env,CPUMIPSState_conflict5 *cpu,int tc)

{
  uint uVar1;
  CPUMIPSState_conflict5 *pCVar2;
  
  uVar1 = cpu->CP0_Status;
  pCVar2 = (CPUMIPSState_conflict5 *)(cpu->tcs + tc);
  if (cpu->current_tc == tc) {
    pCVar2 = cpu;
  }
  (pCVar2->active_tc).CP0_TCStatus =
       (pCVar2->active_tc).CP0_TCStatus & 0x7ffe700U |
       (uint)env->CP0_EntryHi_ASID_mask & (uint)env->CP0_EntryHi |
       (uVar1 & 0x18) << 8 | (uVar1 & 0xf0000000) + (uVar1 & 0x1000000) * 8;
  compute_hflags(cpu);
  return;
}

Assistant:

void sync_c0_status(CPUMIPSState *env, CPUMIPSState *cpu, int tc)
{
    int32_t tcstatus, *tcst;
    uint32_t v = cpu->CP0_Status;
    uint32_t cu, mx, asid, ksu;
    uint32_t mask = ((1 << CP0TCSt_TCU3)
                       | (1 << CP0TCSt_TCU2)
                       | (1 << CP0TCSt_TCU1)
                       | (1 << CP0TCSt_TCU0)
                       | (1 << CP0TCSt_TMX)
                       | (3 << CP0TCSt_TKSU)
                       | (0xff << CP0TCSt_TASID));

    cu = (v >> CP0St_CU0) & 0xf;
    mx = (v >> CP0St_MX) & 0x1;
    ksu = (v >> CP0St_KSU) & 0x3;
    asid = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;

    tcstatus = cu << CP0TCSt_TCU0;
    tcstatus |= mx << CP0TCSt_TMX;
    tcstatus |= ksu << CP0TCSt_TKSU;
    tcstatus |= asid;

    if (tc == cpu->current_tc) {
        tcst = &cpu->active_tc.CP0_TCStatus;
    } else {
        tcst = &cpu->tcs[tc].CP0_TCStatus;
    }

    *tcst &= ~mask;
    *tcst |= tcstatus;
    compute_hflags(cpu);
}